

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O3

void __thiscall hwnet::TCPSocket::sendInWorker(TCPSocket *this)

{
  linklist *plVar1;
  size_t sVar2;
  sendContext *psVar3;
  Poller *this_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  sendContext *psVar7;
  ssize_t sVar8;
  int *piVar9;
  rep rVar10;
  undefined8 uVar11;
  size_t *psVar12;
  _Manager_operation extraout_EDX;
  ulong uVar13;
  sendContext *c;
  pthread_mutex_t *ppVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  bool bVar19;
  undefined1 auStack_d8 [8];
  FlushCallback flushCallback;
  ErrorCallback errorCallback;
  HighWaterCallback highWaterCallback;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  pthread_mutex_t *local_58;
  _Any_data local_50;
  linklist *local_40;
  bool local_31;
  
  flushCallback.super__Function_base._M_functor._8_8_ = 0;
  flushCallback.super__Function_base._M_manager = (_Manager_type)0x0;
  auStack_d8 = (undefined1  [8])0x0;
  flushCallback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  errorCallback.super__Function_base._M_functor._8_8_ = 0;
  errorCallback.super__Function_base._M_manager = (_Manager_type)0x0;
  flushCallback._M_invoker = (_Invoker_type)0x0;
  errorCallback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  errorCallback._M_invoker = (_Invoker_type)0x0;
  ppVar14 = (pthread_mutex_t *)&this->mtx;
  iVar5 = pthread_mutex_lock(ppVar14);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  bVar4 = canWrite(this);
  if (bVar4) {
    if ((this->writeable == false) &&
       (this->highWaterSize < this->bytes4Send && this->highWaterSize != 0)) {
      std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_unsigned_long)>::operator=
                ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_unsigned_long)> *)
                 &errorCallback._M_invoker,&this->highWaterCallback_);
      pthread_mutex_unlock(ppVar14);
      goto LAB_00117a4a;
    }
    plVar1 = this->ptrSendlist;
    iVar5 = this->writeableVer;
    bVar4 = this->slistIdx == 0;
    this->slistIdx = (uint)bVar4;
    this->ptrSendlist = this->sendLists + bVar4;
    local_58 = ppVar14;
    pthread_mutex_unlock(ppVar14);
    psVar7 = plVar1->head;
    if (psVar7 == (sendContext *)0x0) {
      local_31 = true;
      uVar15 = 0;
      iVar17 = 0;
      bVar4 = false;
    }
    else {
      psVar12 = &this->send_iovec[0].iov_len;
      iVar17 = 0;
      uVar13 = 0;
      do {
        sVar2 = psVar7->len;
        *psVar12 = sVar2;
        ((iovec *)(psVar12 + -1))->iov_base = psVar7->ptr;
        iVar17 = (int)sVar2 + iVar17;
        uVar15 = uVar13 + 1;
        psVar7 = psVar7->next;
        bVar4 = psVar7 != (sendContext *)0x0;
        if (psVar7 == (sendContext *)0x0) break;
        psVar12 = psVar12 + 2;
        bVar19 = uVar13 < 0x7f;
        uVar13 = uVar15;
      } while (bVar19);
      local_31 = psVar7 == (sendContext *)0x0;
    }
    local_40 = plVar1;
    do {
      sVar8 = writev(this->fd,(iovec *)this->send_iovec,(int)uVar15);
      if (sVar8 != -1) break;
      piVar9 = __errno_location();
    } while (*piVar9 == 4);
    uVar18 = (uint)sVar8;
    if ((local_31 == true && iVar17 <= (int)uVar18) &&
       (psVar7 = local_40->head, psVar7 != (sendContext *)0x0)) {
      do {
        psVar3 = psVar7->next;
        sendContextPool::put((sendContextPool *)sContextPool,psVar7);
        psVar7 = psVar3;
      } while (psVar3 != (sendContext *)0x0);
      local_40->head = (sendContext *)0x0;
      local_40->tail = (sendContext *)0x0;
    }
    iVar6 = pthread_mutex_lock(local_58);
    if (iVar6 != 0) {
      std::__throw_system_error(iVar6);
    }
    if ((int)uVar18 < 0) {
      piVar9 = __errno_location();
      ppVar14 = local_58;
      if (*piVar9 == 0xb) {
        psVar7 = local_40->head;
        if (psVar7 != (sendContext *)0x0) {
          plVar1 = this->ptrSendlist;
          if (plVar1->head == (sendContext *)0x0) {
            plVar1->tail = local_40->tail;
          }
          else {
            local_40->tail->next = plVar1->head;
          }
          plVar1->head = psVar7;
          local_40->head = (sendContext *)0x0;
          local_40->tail = (sendContext *)0x0;
        }
        if (this->writeableVer == iVar5) {
          this->writeable = false;
          pthread_mutex_unlock(local_58);
          this_00 = this->poller_;
          std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<hwnet::TCPSocket,void>
                    ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                     (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
                     &this->super_enable_shared_from_this<hwnet::TCPSocket>);
          local_50._M_unused._0_8_ = (undefined8)(local_68 + 8);
          if (local_68 == 0) {
            local_50._M_unused._M_object = (void *)0x0;
          }
          local_50._8_8_ = p_Stack_60;
          local_68 = 0;
          p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          Poller::Enable(this_00,(Ptr *)&local_50,4);
          uVar11 = p_Stack_60;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
            uVar11 = p_Stack_60;
          }
LAB_00117bd5:
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11);
          }
          goto LAB_00117a4a;
        }
      }
      else if (((this->closed)._M_base._M_i & 1U) == 0) {
        std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::operator=
                  ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)
                   &flushCallback._M_invoker,&this->errorCallback_);
        this->socketError = true;
        this->err = *piVar9;
        pthread_mutex_unlock(local_58);
        if (errorCallback.super__Function_base._M_functor._8_8_ == 0) goto LAB_00117b3f;
        std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<hwnet::TCPSocket,void>
                  ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)local_50._M_pod_data
                   ,(__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
                    &this->super_enable_shared_from_this<hwnet::TCPSocket>);
        local_68 = CONCAT44(local_68._4_4_,this->err);
        if (errorCallback.super__Function_base._M_functor._8_8_ == 0) goto LAB_00117c00;
        (*errorCallback.super__Function_base._M_manager)
                  ((_Any_data *)&flushCallback._M_invoker,&local_50,(_Manager_operation)&local_68);
        uVar11 = local_50._8_8_;
        goto LAB_00117bd5;
      }
    }
    else {
      bVar19 = this->closedOnFlush;
      if (this->sendTimeout != 0) {
        rVar10 = std::chrono::_V2::steady_clock::now();
        (this->lastSendTime).__d.__r = rVar10;
      }
      uVar15 = (ulong)(uVar18 & 0x7fffffff);
      if ((uVar18 != 0) && (bVar4 || (int)uVar18 < iVar17)) {
        psVar7 = local_40->head;
        uVar13 = psVar7->len;
        uVar16 = uVar15;
        if (uVar13 <= uVar15) {
          do {
            psVar3 = psVar7->next;
            local_40->head = psVar3;
            if (psVar3 == (sendContext *)0x0) {
              local_40->tail = (sendContext *)0x0;
            }
            sendContextPool::put((sendContextPool *)sContextPool,psVar7);
            uVar16 = uVar16 - uVar13;
            psVar7 = local_40->head;
            uVar13 = psVar7->len;
          } while (uVar13 <= uVar16);
        }
        psVar7->ptr = psVar7->ptr + uVar16;
        psVar7->len = uVar13 - uVar16;
        plVar1 = this->ptrSendlist;
        if (plVar1->head == (sendContext *)0x0) {
          plVar1->tail = local_40->tail;
        }
        else {
          local_40->tail->next = plVar1->head;
        }
        plVar1->head = psVar7;
        local_40->head = (sendContext *)0x0;
        local_40->tail = (sendContext *)0x0;
      }
      this->bytes4Send = this->bytes4Send - uVar15;
      ppVar14 = local_58;
      if (this->ptrSendlist->head == (sendContext *)0x0) {
        if (this->shutdown == true) {
          shutdown(this->fd,1);
        }
        ppVar14 = local_58;
        if ((this->flushCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
          std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=
                    ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)auStack_d8,
                     &this->flushCallback_);
          pthread_mutex_unlock(local_58);
          if (flushCallback.super__Function_base._M_functor._8_8_ != 0) {
            std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<hwnet::TCPSocket,void>
                      ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)
                       local_50._M_pod_data,
                       (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
                       &this->super_enable_shared_from_this<hwnet::TCPSocket>);
            if (flushCallback.super__Function_base._M_functor._8_8_ == 0) {
              std::__throw_bad_function_call();
LAB_00117c00:
              uVar11 = std::__throw_bad_function_call();
              if (errorCallback.super__Function_base._M_functor._8_8_ != 0) {
                (*(code *)errorCallback.super__Function_base._M_functor._8_8_)
                          (&flushCallback._M_invoker,&flushCallback._M_invoker,3);
              }
              if (flushCallback.super__Function_base._M_functor._8_8_ != 0) {
                (*(code *)flushCallback.super__Function_base._M_functor._8_8_)
                          (auStack_d8,auStack_d8,3);
              }
              _Unwind_Resume(uVar11);
            }
            (*flushCallback.super__Function_base._M_manager)
                      ((_Any_data *)auStack_d8,&local_50,extraout_EDX);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
            }
          }
          if (bVar19 == false) goto LAB_00117a4a;
LAB_00117b3f:
          Close(this);
          goto LAB_00117a4a;
        }
      }
    }
  }
  pthread_mutex_unlock(ppVar14);
LAB_00117a4a:
  if (errorCallback.super__Function_base._M_functor._8_8_ != 0) {
    (*(code *)errorCallback.super__Function_base._M_functor._8_8_)
              (&flushCallback._M_invoker,&flushCallback._M_invoker,3);
  }
  if (flushCallback.super__Function_base._M_functor._8_8_ != 0) {
    (*(code *)flushCallback.super__Function_base._M_functor._8_8_)(auStack_d8,auStack_d8,3);
  }
  return;
}

Assistant:

void TCPSocket::sendInWorker() {
	
	auto cb = nothing;

	FlushCallback flushCallback = nullptr;
	ErrorCallback errorCallback = nullptr;
	HighWaterCallback highWaterCallback = nullptr;
	size_t bytes4Send_ = 0;
	auto closedOnFlush_ = false;
	auto enableWrite = false;//是否需要调用Enable(Write)


	this->mtx.lock();

	
	if(!this->canWrite()){
		this->mtx.unlock();
		return; 
	} else {
		if(!this->writeable && this->highWater()) {
			cb = callHighwaterCallback;
			bytes4Send_ = this->bytes4Send;
			highWaterCallback = this->highWaterCallback_;
		} else {
			auto localSendlist = this->ptrSendlist;
			auto localVer = this->writeableVer;
			this->slistIdx = this->slistIdx == 0 ? 1 : 0;
			this->ptrSendlist = &this->sendLists[this->slistIdx]; 

			this->mtx.unlock();

			auto c   = 0;
			auto totalBytes = 0;
			auto cur =  localSendlist->head;
			for( ; cur != nullptr && c < max_send_iovec_size; cur = cur->next,++c) {
				send_iovec[c].iov_len = cur->len;
				send_iovec[c].iov_base = cur->ptr;
				totalBytes += cur->len;			
			}

			int n = TEMP_FAILURE_RETRY(::writev(this->fd,&this->send_iovec[0],c));

			if(n >= totalBytes && cur == nullptr){
				localSendlist->clear();
			}

			this->mtx.lock();

			closedOnFlush_ = this->closedOnFlush;

			if(n >= 0) {

				if(this->sendTimeout > 0) {
					this->lastSendTime = std::chrono::steady_clock::now();
				}

				if(n > 0 && (n < totalBytes || cur != nullptr)) {
					//部分发送
					size_t nn = (size_t)n;
					for( ; ; ) {
						auto front = localSendlist->front();
						if(nn >= front->len) {
							nn -= front->len;
							localSendlist->pop_front();
						} else {
							front->ptr += nn;
							front->len -= nn;
							break;
						}
					}
					this->ptrSendlist->add_front(localSendlist);
				}

				this->bytes4Send -= n;
				if(this->ptrSendlist->empty()){
					if(this->shutdown){
						::shutdown(this->fd,SHUT_WR);
					}
					if(this->flushCallback_) {
						flushCallback = this->flushCallback_;
						cb = callFlushCallback;
					}
				}

			} else {
				if(n < 0 && errno == EAGAIN) {
					this->ptrSendlist->add_front(localSendlist);
					if(this->writeableVer == localVer) {
						this->writeable = false;
						enableWrite = true;				
					}
				} else {
					if(!this->closed){
						errorCallback = this->errorCallback_;
						this->socketError = true;
						this->err = errno;
						cb = callErrorCallback;
					}
				}
			}
		}
	}


	this->mtx.unlock();

	if(enableWrite) {
		this->poller_->Enable(shared_from_this(),Poller::Write);
	}

	switch(cb){
		case callHighwaterCallback:{
			if(highWaterCallback){
				highWaterCallback(shared_from_this(),bytes4Send_);
			}			
		}
		break;
		case callFlushCallback:{
			if(flushCallback){
				flushCallback(shared_from_this());
			}
			if(closedOnFlush_){
				this->Close();
			}			
		}
		break;
		case callErrorCallback:{
			if(errorCallback) {
				errorCallback(shared_from_this(),err);
			} else {
				this->Close();
			}				
		}
		break;
		default:{
			return;
		}
	}
}